

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

void __thiscall
TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>::
TPZDohrPrecondV2SubData
          (TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>
           *this,int subindex,
          TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_> *substruct,
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *res_local)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  TPZReference *pTVar3;
  TPZDohrAssembleItem<std::complex<double>_> *this_00;
  
  pTVar2 = substruct->fRef;
  (this->fSubStructure).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  pTVar3 = res_local->fRef;
  (this->fInput_local).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::TPZAutoPointer(&this->fv2_local);
  this_00 = (TPZDohrAssembleItem<std::complex<double>_> *)operator_new(0x98);
  TPZDohrAssembleItem<std::complex<double>_>::TPZDohrAssembleItem
            (this_00,subindex,
             (int)(res_local->fRef->fPointer->super_TPZMatrix<std::complex<double>_>).
                  super_TPZBaseMatrix.fRow);
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator=(&this->fv2_local,this_00);
  return;
}

Assistant:

TPZDohrPrecondV2SubData(int subindex, const TPZAutoPointer<TSubStruct> &substruct, TPZAutoPointer<TPZFMatrix<TVar> > res_local) : fSubStructure(substruct),
	fInput_local(res_local)
	{
		fv2_local = new TPZDohrAssembleItem<TVar>(subindex, res_local->Rows());
	}